

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O3

int SUNNonlinSolSolve_FixedPoint
              (SUNNonlinearSolver NLS,N_Vector y0,N_Vector ycor,N_Vector w,realtype tol,
              int callSetup,void *mem)

{
  uint uVar1;
  N_Vector z;
  N_Vector x;
  N_Vector z_00;
  undefined4 *__s;
  N_Vector p_Var2;
  N_Vector y;
  long lVar3;
  N_Vector *Y;
  realtype *c;
  N_Vector *X;
  double *pdVar4;
  realtype *dotprods;
  N_Vector z_01;
  bool bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined1 (*pauVar10) [16];
  long lVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long *plVar15;
  undefined1 (*pauVar16) [16];
  long lVar17;
  ulong uVar18;
  double *pdVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  uint nvec;
  ulong uVar23;
  double *pdVar24;
  realtype rVar25;
  double dVar26;
  undefined1 auVar27 [16];
  double b;
  undefined1 auVar28 [16];
  double dVar29;
  realtype c_00;
  undefined1 auVar30 [16];
  int iVar31;
  int iVar35;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar38;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  
  auVar27._0_4_ = -(uint)(NLS == (SUNNonlinearSolver)0x0);
  auVar27._4_4_ = -(uint)(y0 == (N_Vector)0x0);
  auVar27._8_4_ = -(uint)(ycor == (N_Vector)0x0);
  auVar27._12_4_ = -(uint)(w == (N_Vector)0x0);
  iVar12 = movmskps((int)w,auVar27);
  iVar7 = -0x385;
  if (((iVar12 == 0 && mem != (void *)0x0) && (plVar15 = (long *)NLS->content, *plVar15 != 0)) &&
     (plVar15[1] != 0)) {
    z = (N_Vector)plVar15[0xd];
    x = (N_Vector)plVar15[0xe];
    z_00 = (N_Vector)plVar15[0x11];
    *(undefined4 *)(plVar15 + 0x12) = 0;
    plVar15[0x13] = 0;
    plVar15[0x14] = 0;
    if (*(int *)((long)plVar15 + 0x94) < 1) {
      lVar11 = 1;
    }
    else {
      do {
        N_VScale(1.0,ycor,z);
        iVar7 = (**NLS->content)(ycor,x,mem);
        plVar15 = (long *)NLS->content;
        if (iVar7 != 0) break;
        uVar9 = *(uint *)(plVar15 + 2);
        uVar23 = (ulong)uVar9;
        if (uVar23 == 0) {
          N_VScale(1.0,x,ycor);
        }
        else {
          uVar1 = *(uint *)(plVar15 + 0x12);
          __s = (undefined4 *)plVar15[3];
          p_Var2 = (N_Vector)plVar15[0x10];
          y = (N_Vector)plVar15[0xf];
          lVar11 = plVar15[9];
          lVar3 = plVar15[10];
          Y = (N_Vector *)plVar15[0xb];
          c = (realtype *)plVar15[8];
          X = (N_Vector *)plVar15[0xc];
          pdVar4 = (double *)plVar15[6];
          dotprods = (realtype *)plVar15[7];
          z_01 = (N_Vector)plVar15[0x11];
          lVar6 = plVar15[4];
          dVar26 = (double)plVar15[5];
          if (0 < (int)uVar9) {
            memset(__s,0,uVar23 * 4);
          }
          uVar8 = uVar1 - 1;
          uVar18 = (long)(int)uVar8 % (long)(int)uVar9 & 0xffffffff;
          N_VLinearSum(1.0,x,-1.0,z,z_01);
          iVar7 = (int)((long)(int)uVar8 % (long)(int)uVar9);
          if (0 < (int)uVar1) {
            N_VLinearSum(1.0,x,-1.0,p_Var2,*(N_Vector *)(lVar3 + (long)iVar7 * 8));
            N_VLinearSum(1.0,z_01,-1.0,y,*(N_Vector *)(lVar11 + (long)iVar7 * 8));
          }
          N_VScale(1.0,x,p_Var2);
          N_VScale(1.0,z_01,y);
          if (uVar1 == 1) {
            p_Var2 = *(N_Vector *)(lVar11 + uVar18 * 8);
            rVar25 = N_VDotProd(p_Var2,p_Var2);
            dVar29 = 0.0;
            if (0.0 < rVar25) {
              p_Var2 = *(N_Vector *)(lVar11 + uVar18 * 8);
              rVar25 = N_VDotProd(p_Var2,p_Var2);
              if (rVar25 < 0.0) {
                dVar29 = sqrt(rVar25);
              }
              else {
                dVar29 = SQRT(rVar25);
              }
            }
            *pdVar4 = dVar29;
            N_VScale(1.0 / dVar29,*(N_Vector *)(lVar11 + uVar18 * 8),Y[uVar18]);
            *__s = 0;
          }
          else {
            if (uVar1 == 0) {
              N_VScale(1.0,x,ycor);
              goto LAB_004ec60f;
            }
            if ((int)uVar9 < (int)uVar1) {
              uVar8 = uVar9 - 1;
              if ((int)uVar9 < 2) {
                N_VScale(1.0,*(N_Vector *)(lVar11 + (long)iVar7 * 8),ycor);
              }
              else {
                uVar20 = (ulong)uVar8;
                pauVar16 = (undefined1 (*) [16])(pdVar4 + uVar23 * 2);
                uVar21 = 2;
                uVar18 = 0;
                do {
                  uVar32 = uVar18 + 1;
                  uVar13 = (ulong)(uVar9 * (int)uVar32);
                  auVar27 = *(undefined1 (*) [16])(pdVar4 + uVar18 + uVar13);
                  dVar29 = auVar27._0_8_ * auVar27._0_8_ + auVar27._8_8_ * auVar27._8_8_;
                  auVar30._0_8_ = (double)(-(ulong)(0.0 < dVar29) & (ulong)SQRT(dVar29));
                  pdVar4[uVar18 + uVar13] = auVar30._0_8_;
                  auVar30._8_8_ = auVar30._0_8_;
                  auVar27 = divpd(auVar27,auVar30);
                  pdVar4[uVar18 + uVar13 + 1] = 0.0;
                  dVar29 = auVar27._0_8_;
                  b = auVar27._8_8_;
                  pauVar10 = pauVar16;
                  uVar13 = uVar23;
                  if (uVar18 + 2 < uVar23) {
                    do {
                      auVar33._8_8_ =
                           *(double *)*pauVar10 * -b + *(double *)((long)*pauVar10 + 8) * dVar29;
                      auVar33._0_8_ =
                           *(double *)*pauVar10 * dVar29 + *(double *)((long)*pauVar10 + 8) * b;
                      *pauVar10 = auVar33;
                      uVar13 = uVar13 - 1;
                      pauVar10 = (undefined1 (*) [16])((long)*pauVar10 + uVar23 * 8);
                    } while (uVar21 != uVar13);
                  }
                  N_VLinearSum(dVar29,Y[uVar18],b,Y[uVar32],ycor);
                  N_VLinearSum(-b,Y[uVar18],dVar29,Y[uVar32],Y[uVar32]);
                  N_VScale(1.0,ycor,Y[uVar18]);
                  uVar21 = uVar21 + 1;
                  pauVar16 = (undefined1 (*) [16])((long)*pauVar16 + (uVar23 + 1) * 8);
                  uVar18 = uVar32;
                } while (uVar32 != uVar20);
                uVar21 = 1;
                pdVar19 = pdVar4;
                uVar18 = uVar20;
                pdVar24 = pdVar4;
                do {
                  do {
                    *pdVar19 = pdVar19[uVar23];
                    uVar18 = uVar18 - 1;
                    pdVar19 = pdVar19 + 1;
                  } while (uVar18 != 0);
                  uVar21 = uVar21 + 1;
                  pdVar19 = pdVar24 + uVar23;
                  uVar18 = uVar20;
                  pdVar24 = pdVar19;
                } while (uVar21 != uVar23);
                N_VScale(1.0,*(N_Vector *)(lVar11 + (long)iVar7 * 8),ycor);
                uVar23 = 0;
                do {
                  rVar25 = N_VDotProd(Y[uVar23],ycor);
                  pdVar4[uVar8 * uVar9 + uVar23] = rVar25;
                  N_VLinearSum(1.0,ycor,-rVar25,Y[uVar23],ycor);
                  uVar23 = uVar23 + 1;
                } while (uVar20 != uVar23);
              }
              rVar25 = N_VDotProd(ycor,ycor);
              dVar29 = 0.0;
              if (0.0 < rVar25) {
                rVar25 = N_VDotProd(ycor,ycor);
                if (rVar25 < 0.0) {
                  dVar29 = sqrt(rVar25);
                }
                else {
                  dVar29 = SQRT(rVar25);
                }
              }
              pdVar4[(long)(int)(uVar9 * uVar9) + -1] = dVar29;
              N_VScale(1.0 / dVar29,ycor,Y[(int)uVar8]);
              auVar33 = _DAT_007568b0;
              auVar30 = _DAT_0074fb40;
              auVar27 = _DAT_0074fb30;
              if ((int)(iVar7 + 1U) < (int)uVar9) {
                uVar23 = (ulong)(uVar8 - iVar7);
                lVar14 = uVar23 - 1;
                auVar28._8_4_ = (int)lVar14;
                auVar28._0_8_ = lVar14;
                auVar28._12_4_ = (int)((ulong)lVar14 >> 0x20);
                uVar18 = 0;
                auVar37 = _DAT_0074fb30;
                auVar34 = _DAT_007568b0;
                do {
                  auVar36 = auVar28 ^ auVar30;
                  auVar39 = auVar37 ^ auVar30;
                  iVar31 = auVar36._4_4_;
                  iVar12 = (int)uVar18;
                  if ((bool)(~(iVar31 < auVar39._4_4_ ||
                              auVar36._0_4_ < auVar39._0_4_ && auVar39._4_4_ == iVar31) & 1)) {
                    __s[uVar18] = iVar7 + iVar12 + 1;
                  }
                  if (auVar39._12_4_ <= auVar36._12_4_ &&
                      (auVar39._8_4_ <= auVar36._8_4_ || auVar39._12_4_ != auVar36._12_4_)) {
                    __s[uVar18 + 1] = iVar7 + iVar12 + 2;
                  }
                  iVar35 = SUB164(auVar34 ^ auVar30,4);
                  if (iVar35 <= iVar31 &&
                      (iVar35 != iVar31 || SUB164(auVar34 ^ auVar30,0) <= auVar36._0_4_)) {
                    __s[uVar18 + 2] = iVar7 + iVar12 + 3;
                    __s[uVar18 + 3] = iVar7 + iVar12 + 4;
                  }
                  uVar18 = uVar18 + 4;
                  lVar14 = auVar37._8_8_;
                  auVar37._0_8_ = auVar37._0_8_ + 4;
                  auVar37._8_8_ = lVar14 + 4;
                  lVar14 = auVar34._8_8_;
                  auVar34._0_8_ = auVar34._0_8_ + 4;
                  auVar34._8_8_ = lVar14 + 4;
                } while ((uVar23 + 3 & 0xfffffffffffffffc) != uVar18);
              }
              else {
                uVar23 = 0;
              }
              if (-1 < iVar7) {
                lVar14 = (ulong)(iVar7 + 1U) - 1;
                auVar36._8_4_ = (int)lVar14;
                auVar36._0_8_ = lVar14;
                auVar36._12_4_ = (int)((ulong)lVar14 >> 0x20);
                uVar18 = 0;
                do {
                  iVar12 = (int)uVar18;
                  auVar39._8_4_ = iVar12;
                  auVar39._0_8_ = uVar18;
                  auVar39._12_4_ = (int)(uVar18 >> 0x20);
                  auVar37 = (auVar39 | auVar27) ^ auVar30;
                  iVar31 = SUB164(auVar36 ^ auVar30,0);
                  bVar5 = iVar31 < auVar37._0_4_;
                  iVar35 = SUB164(auVar36 ^ auVar30,4);
                  iVar38 = auVar37._4_4_;
                  if ((bool)(~(iVar35 < iVar38 || iVar38 == iVar35 && bVar5) & 1)) {
                    __s[uVar23 + uVar18] = iVar12;
                  }
                  if (iVar35 >= iVar38 && (iVar38 != iVar35 || !bVar5)) {
                    __s[uVar23 + uVar18 + 1] = iVar12 + 1;
                  }
                  auVar37 = (auVar39 | auVar33) ^ auVar30;
                  iVar38 = auVar37._4_4_;
                  if (iVar38 <= iVar35 && (iVar38 != iVar35 || auVar37._0_4_ <= iVar31)) {
                    __s[uVar23 + uVar18 + 2] = iVar12 + 2;
                    __s[uVar23 + uVar18 + 3] = iVar12 + 3;
                  }
                  uVar18 = uVar18 + 4;
                } while ((iVar7 + 4U & 0xfffffffc) != uVar18);
              }
            }
            else {
              N_VScale(1.0,*(N_Vector *)(lVar11 + (long)iVar7 * 8),ycor);
              if (1 < (int)uVar1) {
                uVar23 = 0;
                do {
                  __s[uVar23] = (int)uVar23;
                  rVar25 = N_VDotProd(Y[uVar23],ycor);
                  pdVar4[(long)(int)(uVar8 * uVar9) + uVar23] = rVar25;
                  N_VLinearSum(1.0,ycor,-rVar25,Y[uVar23],ycor);
                  uVar23 = uVar23 + 1;
                } while (uVar8 != uVar23);
              }
              rVar25 = N_VDotProd(ycor,ycor);
              c_00 = 0.0;
              if (rVar25 <= 0.0) {
                pdVar4[(long)(int)(uVar9 * uVar8 + uVar1) + -1] = 0.0;
              }
              else {
                rVar25 = N_VDotProd(ycor,ycor);
                if (rVar25 < 0.0) {
                  dVar29 = sqrt(rVar25);
                }
                else {
                  dVar29 = SQRT(rVar25);
                }
                pdVar4[(long)(int)(uVar8 * uVar9 + uVar1) + -1] = dVar29;
                c_00 = 0.0;
                if ((dVar29 != 0.0) || (NAN(dVar29))) {
                  c_00 = 1.0 / dVar29;
                }
              }
              N_VScale(c_00,ycor,Y[iVar7]);
              __s[(int)uVar8] = uVar8;
            }
          }
          uVar8 = uVar1;
          if ((int)uVar9 < (int)uVar1) {
            uVar8 = uVar9;
          }
          uVar23 = (ulong)uVar8;
          iVar7 = N_VDotProdMulti(uVar8,z_01,Y,dotprods);
          if (iVar7 == 0) {
            *c = 1.0;
            *X = x;
            if ((int)uVar8 < 1) {
              if ((int)lVar6 == 0) {
                nvec = 1;
              }
              else {
                c[1] = -(1.0 - dVar26);
                X[1] = z_01;
                nvec = 2;
              }
            }
            else {
              lVar14 = (long)(int)uVar9;
              nvec = uVar8 + 1;
              uVar21 = (ulong)nvec;
              pdVar19 = (double *)((long)pdVar4 + (lVar14 * 8 + 8) * uVar23 + -8);
              uVar20 = 1;
              lVar17 = 0;
              uVar32 = (ulong)DAT_0074fb00;
              uVar18 = uVar23;
              do {
                rVar25 = dotprods[uVar18 - 1];
                uVar13 = uVar18 - 1;
                lVar22 = lVar17;
                pdVar24 = pdVar19;
                if ((long)uVar18 < (long)uVar23) {
                  do {
                    rVar25 = rVar25 - *pdVar24 * dotprods[uVar23 + lVar22];
                    dotprods[uVar13] = rVar25;
                    lVar22 = lVar22 + 1;
                    pdVar24 = pdVar24 + lVar14;
                  } while ((int)lVar22 != 0);
                }
                dVar29 = 0.0;
                if ((rVar25 != 0.0) || (NAN(rVar25))) {
                  dVar29 = rVar25 / pdVar4[(int)((uVar9 + 1) * (int)uVar13)];
                }
                dotprods[uVar13] = dVar29;
                c[uVar20] = (realtype)((ulong)dVar29 ^ uVar32);
                X[uVar20] = *(N_Vector *)(lVar3 + (long)(int)__s[uVar13] * 8);
                uVar20 = uVar20 + 1;
                lVar17 = lVar17 + -1;
                pdVar19 = (double *)((long)pdVar19 + (lVar14 * 8 ^ 0xfffffffffffffff8U));
                uVar18 = uVar13;
              } while (uVar20 != uVar21);
              if ((int)lVar6 != 0) {
                dVar26 = 1.0 - dVar26;
                c[uVar21] = (realtype)((ulong)dVar26 ^ uVar32);
                X[uVar21] = z_01;
                uVar18 = 0xffffffffffffffff;
                uVar23 = (ulong)(uVar8 - 1);
                do {
                  c[uVar21 + uVar18 + 2] = dotprods[uVar23] * dVar26;
                  X[uVar21 + uVar18 + 2] = *(N_Vector *)(lVar11 + (long)(int)__s[uVar23] * 8);
                  uVar23 = uVar23 - 1;
                  uVar18 = uVar18 + 1;
                } while (uVar8 - 1 != uVar18);
                if ((int)uVar1 < lVar14) {
                  uVar9 = uVar1;
                }
                nvec = uVar9 + (int)uVar18 + 3;
              }
            }
            N_VLinearCombination(nvec,c,X,ycor);
          }
        }
LAB_004ec60f:
        plVar15 = (long *)((long)NLS->content + 0x98);
        *plVar15 = *plVar15 + 1;
        N_VLinearSum(1.0,ycor,-1.0,z,z_00);
        iVar7 = (**(code **)((long)NLS->content + 8))
                          (tol,NLS,ycor,z_00,w,*(undefined8 *)((long)NLS->content + 0xa8));
        if (iVar7 != 0x385) {
          if (iVar7 == 0) {
            return 0;
          }
          plVar15 = (long *)((long)NLS->content + 0xa0);
          *plVar15 = *plVar15 + 1;
          return iVar7;
        }
        plVar15 = (long *)NLS->content;
        iVar7 = (int)plVar15[0x12] + 1;
        *(int *)(plVar15 + 0x12) = iVar7;
      } while (iVar7 < *(int *)((long)plVar15 + 0x94));
      lVar11 = plVar15[0x14] + 1;
    }
    plVar15[0x14] = lVar11;
    iVar7 = 0x386;
  }
  return iVar7;
}

Assistant:

int SUNNonlinSolSolve_FixedPoint(SUNNonlinearSolver NLS, N_Vector y0,
                                 N_Vector ycor, N_Vector w, realtype tol,
                                 booleantype callSetup, void* mem)
{
  /* local variables */
  int retval;
  N_Vector yprev, gy, delta;

  /* check that the inputs are non-null */
  if ( (NLS  == NULL) ||
       (y0   == NULL) ||
       (ycor == NULL) ||
       (w    == NULL) ||
       (mem  == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* check that all required function pointers have been set */
  if ( (FP_CONTENT(NLS)->Sys == NULL) || (FP_CONTENT(NLS)->CTest == NULL) )
    return(SUN_NLS_MEM_NULL);

  /* set local shortcut variables */
  yprev = FP_CONTENT(NLS)->yprev;
  gy    = FP_CONTENT(NLS)->gy;
  delta = FP_CONTENT(NLS)->delta;

  /* initialize iteration and convergence fail counters for this solve */
  FP_CONTENT(NLS)->niters     = 0;
  FP_CONTENT(NLS)->nconvfails = 0;

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  /* print current iteration number and the nonlinear residual */
  if (FP_CONTENT(NLS)->print_level && FP_CONTENT(NLS)->info_file
      && (FP_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
  {
    fprintf(FP_CONTENT(NLS)->info_file,
            "SUNNONLINSOL_FIXEDPOINT (nni=%ld):\n",
            (long int) FP_CONTENT(NLS)->niters);
  }
  SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
    "SUNNonlinSolSolve_FixedPoint", "begin-iteration",
    "iter = %ld, nni = %ld", (long int) 0, FP_CONTENT(NLS)->niters);
#endif

  /* Looping point for attempts at solution of the nonlinear system:
       Evaluate fixed-point function (store in gy).
       Performs the accelerated fixed-point iteration.
       Performs stopping tests. */
  for( FP_CONTENT(NLS)->curiter = 0;
       FP_CONTENT(NLS)->curiter < FP_CONTENT(NLS)->maxiters;
       FP_CONTENT(NLS)->curiter++ ) {

    /* update previous solution guess */
    N_VScale(ONE, ycor, yprev);

    /* compute fixed-point iteration function, store in gy */
    retval = FP_CONTENT(NLS)->Sys(ycor, gy, mem);
    if (retval != SUN_NLS_SUCCESS) break;

    /* perform fixed point update, based on choice of acceleration or not */
    if (FP_CONTENT(NLS)->m == 0) {    /* basic fixed-point solver */
      N_VScale(ONE, gy, ycor);
    } else {                          /* Anderson-accelerated solver */
      retval = AndersonAccelerate(NLS, gy, ycor, yprev, FP_CONTENT(NLS)->curiter);
    }

    /* increment nonlinear solver iteration counter */
    FP_CONTENT(NLS)->niters++;

    /* compute change in solution, and call the convergence test function */
    N_VLinearSum(ONE, ycor, -ONE, yprev, delta);

    /* test for convergence */
    retval = FP_CONTENT(NLS)->CTest(NLS, ycor, delta, tol, w,
                                    FP_CONTENT(NLS)->ctest_data);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    /* print current iteration number and the nonlinear residual */
    if (FP_CONTENT(NLS)->print_level && FP_CONTENT(NLS)->info_file
        && (FP_CONTENT(NLS)->info_file != NLS->sunctx->logger->info_fp))
    {
      fprintf(FP_CONTENT(NLS)->info_file,
              "SUNNONLINSOL_FIXEDPOINT (nni=%ld):\n",
              (long int) FP_CONTENT(NLS)->niters);
    }
    SUNLogger_QueueMsg(NLS->sunctx->logger, SUN_LOGLEVEL_INFO,
      "SUNNonlinSolSolve_FixedPoint", "end-of-iterate",
      "iter = %ld, nni = %ld, wrmsnorm = %.16g",  (long int) FP_CONTENT(NLS)->curiter,
      FP_CONTENT(NLS)->niters, N_VWrmsNorm(delta, w));
#endif

    /* return if successful */
    if (retval == SUN_NLS_SUCCESS)  return(SUN_NLS_SUCCESS);

    /* check if the iterations should continue; otherwise increment the
       convergence failure count and return error flag */
    if (retval != SUN_NLS_CONTINUE) {
      FP_CONTENT(NLS)->nconvfails++;
      return(retval);
    }

  }

  /* if we've reached this point, then we exhausted the iteration limit;
     increment the convergence failure count and return */
  FP_CONTENT(NLS)->nconvfails++;
  return(SUN_NLS_CONV_RECVR);
}